

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O0

bool JumpBasic::isprune(Varnode *vn)

{
  bool bVar1;
  int4 iVar2;
  PcodeOp *this;
  PcodeOp *op;
  Varnode *vn_local;
  
  bVar1 = Varnode::isWritten(vn);
  if (bVar1) {
    this = Varnode::getDef(vn);
    bVar1 = PcodeOp::isCall(this);
    if ((!bVar1) && (bVar1 = PcodeOp::isMarker(this), !bVar1)) {
      iVar2 = PcodeOp::numInput(this);
      if (iVar2 != 0) {
        return false;
      }
      return true;
    }
  }
  return true;
}

Assistant:

bool JumpBasic::isprune(Varnode *vn)

{
  if (!vn->isWritten()) return true;
  PcodeOp *op = vn->getDef();
  if (op->isCall()||op->isMarker()) return true;
  if (op->numInput()==0) return true;
  return false;
}